

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleRPathRemoveCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  char *pcVar1;
  cmCommand *this_00;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  cmSystemToolsFileTime *t;
  size_t sVar6;
  ulong uVar7;
  pointer pbVar8;
  ulong uVar9;
  pointer filename;
  bool removed;
  string emsg;
  ostringstream e;
  bool local_1f1;
  string local_1f0;
  cmCommand *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8)) {
    filename = (char *)0x0;
    bVar3 = false;
    uVar2 = 2;
    uVar9 = 1;
    local_1d0 = &this->super_cmCommand;
    do {
      uVar7 = uVar2;
      iVar5 = std::__cxx11::string::compare((char *)(pbVar8 + uVar9));
      this_00 = local_1d0;
      if (iVar5 == 0) {
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar3 = true;
      }
      else {
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"RPATH_REMOVE given unknown argument ",0x24);
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,pbVar8[uVar9]._M_dataplus._M_p,
                     pbVar8[uVar9]._M_string_length);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(local_1d0,&local_1f0);
          goto LAB_0027b111;
        }
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        filename = pbVar8[uVar9]._M_dataplus._M_p;
        bVar3 = false;
      }
      uVar2 = (ulong)((int)uVar7 + 1);
      uVar9 = uVar7;
    } while (uVar7 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5))
    ;
    this = (cmFileCommand *)local_1d0;
    if (filename != (char *)0x0) {
      bVar3 = cmsys::SystemTools::FileExists(filename,true);
      if (bVar3) {
        t = cmSystemTools::FileTimeNew();
        bVar3 = cmSystemTools::FileTimeGet(filename,t);
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        local_1f0._M_string_length = 0;
        local_1f0.field_2._M_local_buf[0] = '\0';
        pcVar1 = local_1a8 + 0x10;
        local_1a8._0_8_ = pcVar1;
        sVar6 = strlen(filename);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,filename,filename + sVar6);
        bVar4 = cmSystemTools::RemoveRPath((string *)local_1a8,&local_1f0,&local_1f1);
        if ((char *)local_1a8._0_8_ != pcVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (bVar4) {
          if (local_1f1 == true) {
            local_1a8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"Removed runtime path from \"","");
            std::__cxx11::string::append(local_1a8);
            std::__cxx11::string::append(local_1a8);
            cmMakefile::DisplayStatus(this_00->Makefile,(char *)local_1a8._0_8_,-1.0);
            if ((char *)local_1a8._0_8_ != pcVar1) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
          }
          if (bVar3) {
            cmSystemTools::FileTimeSet(filename,t);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"RPATH_REMOVE could not remove RPATH from file:\n",0x2f);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
          sVar6 = strlen(filename);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,filename,sVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(this_00,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        cmSystemTools::FileTimeDelete(t);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,
                          CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                   local_1f0.field_2._M_local_buf[0]) + 1);
          return bVar4;
        }
        return bVar4;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"RPATH_REMOVE given FILE \"",0x19);
      sVar6 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,filename,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\" that does not exist.",0x16);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(this_00,&local_1f0);
LAB_0027b111:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                 local_1f0.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return false;
    }
  }
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"RPATH_REMOVE not given FILE option.","");
  cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  return false;
}

Assistant:

bool
cmFileCommand::HandleRPathRemoveCommand(std::vector<std::string> const& args)
{
  // Evaluate arguments.
  const char* file = 0;
  enum Doing { DoingNone, DoingFile };
  Doing doing = DoingNone;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "FILE")
      {
      doing = DoingFile;
      }
    else if(doing == DoingFile)
      {
      file = args[i].c_str();
      doing = DoingNone;
      }
    else
      {
      std::ostringstream e;
      e << "RPATH_REMOVE given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
      }
    }
  if(!file)
    {
    this->SetError("RPATH_REMOVE not given FILE option.");
    return false;
    }
  if(!cmSystemTools::FileExists(file, true))
    {
    std::ostringstream e;
    e << "RPATH_REMOVE given FILE \"" << file << "\" that does not exist.";
    this->SetError(e.str());
    return false;
    }
  bool success = true;
  cmSystemToolsFileTime* ft = cmSystemTools::FileTimeNew();
  bool have_ft = cmSystemTools::FileTimeGet(file, ft);
  std::string emsg;
  bool removed;
  if(!cmSystemTools::RemoveRPath(file, &emsg, &removed))
    {
    std::ostringstream e;
    e << "RPATH_REMOVE could not remove RPATH from file:\n"
      << "  " << file << "\n"
      << emsg;
    this->SetError(e.str());
    success = false;
    }
  if(success)
    {
    if(removed)
      {
      std::string message = "Removed runtime path from \"";
      message += file;
      message += "\"";
      this->Makefile->DisplayStatus(message.c_str(), -1);
      }
    if(have_ft)
      {
      cmSystemTools::FileTimeSet(file, ft);
      }
    }
  cmSystemTools::FileTimeDelete(ft);
  return success;
}